

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaThread.cpp
# Opt level: O2

bool __thiscall xmrig::CudaThread::isEqual(CudaThread *this,CudaThread *other)

{
  int iVar1;
  
  iVar1 = memcmp(this,other,0x1c);
  return iVar1 == 0;
}

Assistant:

bool xmrig::CudaThread::isEqual(const CudaThread &other) const
{
    return m_blocks      == other.m_blocks &&
           m_threads     == other.m_threads &&
           m_affinity    == other.m_affinity &&
           m_index       == other.m_index &&
           m_bfactor     == other.m_bfactor &&
           m_bsleep      == other.m_bsleep;
}